

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgtAig.c
# Opt level: O0

void Cgt_ManCollectVisited(Aig_Man_t *pAig,Vec_Ptr_t *vFanout,Vec_Ptr_t *vVisited)

{
  int iVar1;
  Aig_Obj_t *pObj_00;
  undefined4 local_2c;
  int i;
  Aig_Obj_t *pObj;
  Vec_Ptr_t *vVisited_local;
  Vec_Ptr_t *vFanout_local;
  Aig_Man_t *pAig_local;
  
  Vec_PtrClear(vVisited);
  Aig_ManIncrementTravId(pAig);
  for (local_2c = 0; iVar1 = Vec_PtrSize(vFanout), local_2c < iVar1; local_2c = local_2c + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(vFanout,local_2c);
    Cgt_ManCollectVisited_rec(pAig,pObj_00,vVisited);
  }
  return;
}

Assistant:

void Cgt_ManCollectVisited( Aig_Man_t * pAig, Vec_Ptr_t * vFanout, Vec_Ptr_t * vVisited )
{
    Aig_Obj_t * pObj;
    int i;
    Vec_PtrClear( vVisited );
    Aig_ManIncrementTravId( pAig );
    Vec_PtrForEachEntry( Aig_Obj_t *, vFanout, pObj, i )
        Cgt_ManCollectVisited_rec( pAig, pObj, vVisited );
}